

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_primitive_field_lite.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::RepeatedImmutablePrimitiveFieldLiteGenerator::GenerateMembers
          (RepeatedImmutablePrimitiveFieldLiteGenerator *this,Printer *printer)

{
  bool bVar1;
  FieldDescriptor *in_RDI;
  char *in_stack_00000028;
  Printer *in_stack_00000030;
  Printer *in_stack_00000038;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_00000040;
  bool in_stack_000000a3;
  FieldAccessorType in_stack_000000a4;
  FieldDescriptor *in_stack_000000a8;
  Printer *in_stack_000000b0;
  char *in_stack_000001c0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_000001c8;
  Printer *in_stack_000001d0;
  Descriptor *in_stack_ffffffffffffffd8;
  Context *this_00;
  
  io::Printer::Print(in_stack_000001d0,in_stack_000001c8,in_stack_000001c0);
  PrintExtraFieldInfo(in_stack_00000040,in_stack_00000038);
  WriteFieldAccessorDocComment
            (in_stack_000000b0,in_stack_000000a8,in_stack_000000a4,in_stack_000000a3);
  io::Printer::Print(in_stack_000001d0,in_stack_000001c8,in_stack_000001c0);
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (in_stack_00000030,in_stack_00000028,(char *)this,(FieldDescriptor *)printer);
  WriteFieldAccessorDocComment
            (in_stack_000000b0,in_stack_000000a8,in_stack_000000a4,in_stack_000000a3);
  io::Printer::Print(in_stack_000001d0,in_stack_000001c8,in_stack_000001c0);
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (in_stack_00000030,in_stack_00000028,(char *)this,(FieldDescriptor *)printer);
  WriteFieldAccessorDocComment
            (in_stack_000000b0,in_stack_000000a8,in_stack_000000a4,in_stack_000000a3);
  io::Printer::Print(in_stack_000001d0,in_stack_000001c8,in_stack_000001c0);
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (in_stack_00000030,in_stack_00000028,(char *)this,(FieldDescriptor *)printer);
  bVar1 = anon_unknown_6::EnableExperimentalRuntimeForLite();
  if ((!bVar1) && (bVar1 = FieldDescriptor::is_packed(in_RDI), bVar1)) {
    this_00 = *(Context **)(in_RDI + 0x40);
    FieldDescriptor::containing_type(*(FieldDescriptor **)(in_RDI + 8));
    bVar1 = Context::HasGeneratedMethods(this_00,in_stack_ffffffffffffffd8);
    if (bVar1) {
      io::Printer::Print(in_stack_000001d0,in_stack_000001c8,in_stack_000001c0);
    }
  }
  io::Printer::Print(in_stack_000001d0,in_stack_000001c8,in_stack_000001c0);
  WriteFieldAccessorDocComment
            (in_stack_000000b0,in_stack_000000a8,in_stack_000000a4,in_stack_000000a3);
  io::Printer::Print(in_stack_000001d0,in_stack_000001c8,in_stack_000001c0);
  WriteFieldAccessorDocComment
            (in_stack_000000b0,in_stack_000000a8,in_stack_000000a4,in_stack_000000a3);
  io::Printer::Print(in_stack_000001d0,in_stack_000001c8,in_stack_000001c0);
  WriteFieldAccessorDocComment
            (in_stack_000000b0,in_stack_000000a8,in_stack_000000a4,in_stack_000000a3);
  io::Printer::Print(in_stack_000001d0,in_stack_000001c8,in_stack_000001c0);
  WriteFieldAccessorDocComment
            (in_stack_000000b0,in_stack_000000a8,in_stack_000000a4,in_stack_000000a3);
  io::Printer::Print(in_stack_000001d0,in_stack_000001c8,in_stack_000001c0);
  return;
}

Assistant:

void RepeatedImmutablePrimitiveFieldLiteGenerator::GenerateMembers(
    io::Printer* printer) const {
  printer->Print(variables_, "private $field_list_type$ $name$_;\n");
  PrintExtraFieldInfo(variables_, printer);
  WriteFieldAccessorDocComment(printer, descriptor_, LIST_GETTER);
  printer->Print(variables_,
                 "@java.lang.Override\n"
                 "$deprecation$public java.util.List<$boxed_type$>\n"
                 "    ${$get$capitalized_name$List$}$() {\n"
                 "  return $name$_;\n"  // note:  unmodifiable list
                 "}\n");
  printer->Annotate("{", "}", descriptor_);
  WriteFieldAccessorDocComment(printer, descriptor_, LIST_COUNT);
  printer->Print(
      variables_,
      "@java.lang.Override\n"
      "$deprecation$public int ${$get$capitalized_name$Count$}$() {\n"
      "  return $name$_.size();\n"
      "}\n");
  printer->Annotate("{", "}", descriptor_);
  WriteFieldAccessorDocComment(printer, descriptor_, LIST_INDEXED_GETTER);
  printer->Print(
      variables_,
      "@java.lang.Override\n"
      "$deprecation$public $type$ ${$get$capitalized_name$$}$(int index) {\n"
      "  return $repeated_get$(index);\n"
      "}\n");
  printer->Annotate("{", "}", descriptor_);

  if (!EnableExperimentalRuntimeForLite() && descriptor_->is_packed() &&
      context_->HasGeneratedMethods(descriptor_->containing_type())) {
    printer->Print(variables_,
                   "private int $name$MemoizedSerializedSize = -1;\n");
  }

  printer->Print(
      variables_,
      "private void ensure$capitalized_name$IsMutable() {\n"
      "  if (!$is_mutable$) {\n"
      "    $name$_ =\n"
      "        com.google.protobuf.GeneratedMessageLite.mutableCopy($name$_);\n"
      "   }\n"
      "}\n");

  WriteFieldAccessorDocComment(printer, descriptor_, LIST_INDEXED_SETTER);
  printer->Print(variables_,
                 "private void set$capitalized_name$(\n"
                 "    int index, $type$ value) {\n"
                 "$null_check$"
                 "  ensure$capitalized_name$IsMutable();\n"
                 "  $repeated_set$(index, value);\n"
                 "}\n");
  WriteFieldAccessorDocComment(printer, descriptor_, LIST_ADDER);
  printer->Print(variables_,
                 "private void add$capitalized_name$($type$ value) {\n"
                 "$null_check$"
                 "  ensure$capitalized_name$IsMutable();\n"
                 "  $repeated_add$(value);\n"
                 "}\n");
  WriteFieldAccessorDocComment(printer, descriptor_, LIST_MULTI_ADDER);
  printer->Print(variables_,
                 "private void addAll$capitalized_name$(\n"
                 "    java.lang.Iterable<? extends $boxed_type$> values) {\n"
                 "  ensure$capitalized_name$IsMutable();\n"
                 "  com.google.protobuf.AbstractMessageLite.addAll(\n"
                 "      values, $name$_);\n"
                 "}\n");
  WriteFieldAccessorDocComment(printer, descriptor_, CLEARER);
  printer->Print(variables_,
                 "private void clear$capitalized_name$() {\n"
                 "  $name$_ = $empty_list$;\n"
                 "}\n");
}